

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

Vec_Ptr_t * Prs_CreateDetectRams(Prs_Ntk_t *pNtk)

{
  int NameRamId;
  int iVar1;
  int iVar2;
  char *__s1;
  char *Entry;
  Vec_Ptr_t *p;
  Vec_Ptr_t *pVVar3;
  char *pcVar4;
  Vec_Int_t *pVVar5;
  int i;
  
  NameRamId = Abc_NamStrFind(pNtk->pStrs,"Ram");
  i = 0;
  p = (Vec_Ptr_t *)0x0;
  do {
    if ((pNtk->vObjs).nSize <= i) {
      return p;
    }
    Prs_BoxSignals(pNtk,i);
    iVar1 = Prs_BoxIsNode(pNtk,i);
    if (iVar1 == 0) {
      iVar1 = Prs_BoxNtk(pNtk,i);
      __s1 = Prs_NtkStr(pNtk,iVar1);
      iVar1 = strncmp(__s1,"ClockedWritePort_",0x11);
      if (iVar1 != 0) {
        iVar2 = strncmp(__s1,"ReadPort_",9);
        if (iVar2 != 0) goto LAB_002e9a67;
      }
      Entry = Prs_CreateDetectRamPort(pNtk,&Prs_BoxSignals::V,NameRamId);
      if (Entry == (char *)0x0) {
        __assert_fail("pRamName",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                      ,0x6d6,"Vec_Ptr_t *Prs_CreateDetectRams(Prs_Ntk_t *)");
      }
      if (p == (Vec_Ptr_t *)0x0) {
        p = Vec_PtrAlloc(4);
      }
      for (iVar2 = 0; iVar2 < p->nSize; iVar2 = iVar2 + 1) {
        pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(p,iVar2);
        pcVar4 = (char *)Vec_PtrEntry(pVVar3,0);
        if (Entry == pcVar4) {
          if (iVar1 == 0) {
            pVVar5 = Vec_IntDup(&Prs_BoxSignals::V);
            Vec_IntPush(pVVar5,i);
            Vec_PtrPush(pVVar3,pVVar5);
          }
          break;
        }
      }
      if (p->nSize <= iVar2) {
        pVVar3 = Vec_PtrAlloc(4);
        Vec_PtrPush(pVVar3,Entry);
        iVar2 = Prs_CreateGetMemSize(__s1);
        Vec_PtrPush(pVVar3,(void *)(long)iVar2);
        if (iVar1 == 0) {
          pVVar5 = Vec_IntDup(&Prs_BoxSignals::V);
          Vec_IntPush(pVVar5,i);
          Vec_PtrPush(pVVar3,pVVar5);
        }
        Vec_PtrPush(p,pVVar3);
      }
    }
LAB_002e9a67:
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Prs_CreateDetectRams( Prs_Ntk_t * pNtk )
{
    Vec_Ptr_t * vAllRams = NULL, * vRam; 
    Vec_Int_t * vBox, * vBoxCopy; 
    char * pNtkName, * pRamName;
    int NameRamId = Abc_NamStrFind( pNtk->pStrs, "Ram" );
    int i, k, fWrite;
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        if ( Prs_BoxIsNode(pNtk, i) ) // node
            continue;
        pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
        fWrite = !strncmp(pNtkName, "ClockedWritePort_", strlen("ClockedWritePort_"));
        if ( fWrite || !strncmp(pNtkName, "ReadPort_", strlen("ReadPort_")) )
        {
            pRamName = Prs_CreateDetectRamPort( pNtk, vBox, NameRamId ); assert( pRamName );
            if ( vAllRams == NULL )
                vAllRams = Vec_PtrAlloc( 4 );
            Vec_PtrForEachEntry( Vec_Ptr_t *, vAllRams, vRam, k )
                if ( pRamName == (char *)Vec_PtrEntry(vRam, 0) )
                {
                    if ( fWrite )
                    {
                        vBoxCopy = Vec_IntDup(vBox);
                        Vec_IntPush( vBoxCopy, i );
                        Vec_PtrPush( vRam, vBoxCopy );
                    }
                    break;
                }
            if ( k < Vec_PtrSize(vAllRams) )
                continue;
            vRam = Vec_PtrAlloc( 4 );
            Vec_PtrPush( vRam, pRamName );
            Vec_PtrPush( vRam, Abc_Int2Ptr(Prs_CreateGetMemSize(pNtkName)) );
            if ( fWrite )
            {
                vBoxCopy = Vec_IntDup(vBox);
                Vec_IntPush( vBoxCopy, i );
                Vec_PtrPush( vRam, vBoxCopy );
            }
            Vec_PtrPush( vAllRams, vRam );
        }
    }
    return vAllRams;
}